

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode multi_runsingle(Curl_multi *multi,timeval now,Curl_easy *data)

{
  timeval start;
  timeval start_00;
  timeval now_00;
  timeval now_01;
  timeval now_02;
  timeval now_03;
  timeval newer;
  timeval newer_00;
  timeval newer_01;
  timeval newer_02;
  timeval now_04;
  Curl_message *pCVar1;
  _Bool _Var2;
  CURLcode CVar3;
  CURLMSG CVar4;
  int iVar5;
  time_t tVar6;
  CURLMstate CVar7;
  _Bool local_111;
  followtype fStack_bc;
  _Bool dead_connection;
  CURLcode res;
  followtype follow_1;
  CURLcode ret;
  _Bool comeback;
  _Bool retry_1;
  char *newurl_1;
  CURLMSG local_a0;
  undefined4 uStack_9c;
  _Bool retry;
  CURLcode drc;
  followtype follow;
  char *newurl;
  WildcardData *wc;
  char *hostname;
  connectdata *conn;
  Curl_dns_entry *dns;
  _Bool stream_error;
  long lStack_68;
  int control;
  time_t send_timeout_ms;
  time_t recv_timeout_ms;
  time_t timeout_ms;
  SingleRequest *k;
  CURLcode result;
  CURLMcode rc;
  _Bool done;
  _Bool dophase_done;
  _Bool protocol_connect;
  _Bool async;
  CURL_conflict **ppCStack_38;
  _Bool connected;
  Curl_message *msg;
  Curl_easy *data_local;
  Curl_multi *multi_local;
  timeval now_local;
  
  now_local.tv_sec = now.tv_usec;
  multi_local = (Curl_multi *)now.tv_sec;
  ppCStack_38 = (CURL_conflict **)0x0;
  rc._1_1_ = CURLM_OK >> 8;
  rc._0_1_ = CURLM_OK;
  result._3_1_ = CURLE_OK >> 0x18;
  k._0_4_ = CURLMSG_NONE;
  if ((data == (Curl_easy *)0x0) ||
     (msg = (Curl_message *)data, data_local = (Curl_easy *)multi, data->magic != 0xc0dedbad)) {
    now_local.tv_usec._4_4_ = CURLM_BAD_EASY_HANDLE;
  }
  else {
    do {
      dns._3_1_ = 0;
      k._4_4_ = CURLM_OK;
      if (((ulong)msg[0x1a2].extmsg.data.whatever & 0x100) == 0) {
        if ((((msg->list).next == (curl_llist_element *)0x0) && (CURLMSG_LAST < msg[1].extmsg.msg))
           && (msg[1].extmsg.msg < 0x10)) {
          Curl_failf((Curl_easy *)msg,"In state %d with no easy_conn, bail out!\n",
                     (ulong)msg[1].extmsg.msg);
          return CURLM_INTERNAL_ERROR;
        }
        _Var2 = multi_ischanged((Curl_multi *)data_local,true);
        if (_Var2) {
          Curl_multi_process_pending_handles((Curl_multi *)data_local);
        }
        if ((((msg->list).next != (curl_llist_element *)0x0) && (CURLMSG_LAST < msg[1].extmsg.msg))
           && (msg[1].extmsg.msg < 0x11)) {
          ((msg->list).next)->ptr = msg;
        }
        if ((((msg->list).next == (curl_llist_element *)0x0) || (msg[1].extmsg.msg < CURLMSG_LAST))
           || ((0x10 < msg[1].extmsg.msg ||
               (recv_timeout_ms =
                     Curl_timeleft((Curl_easy *)msg,(timeval *)&multi_local,msg[1].extmsg.msg < 9),
               pCVar1 = msg, -1 < recv_timeout_ms)))) {
          switch(msg[1].extmsg.msg) {
          case CURLMSG_NONE:
            k._0_4_ = Curl_pretransfer((Curl_easy *)msg);
            if ((CURLMSG)k == CURLMSG_NONE) {
              mstate((Curl_easy *)msg,CURLM_STATE_CONNECT);
              Curl_pgrsTime((Curl_easy *)msg,TIMER_STARTOP);
              k._4_4_ = CURLM_CALL_MULTI_PERFORM;
            }
            break;
          case CURLMSG_DONE:
            break;
          case CURLMSG_LAST:
            Curl_pgrsTime((Curl_easy *)msg,TIMER_STARTSINGLE);
            k._0_4_ = Curl_connect((Curl_easy *)msg,(connectdata **)&(msg->list).next,
                                   (_Bool *)((long)&rc + 2),(_Bool *)((long)&rc + 1));
            if ((CURLMSG)k == 0x59) {
              mstate((Curl_easy *)msg,CURLM_STATE_CONNECT_PEND);
              Curl_llist_insert_next
                        ((curl_llist *)&(data_local->pipeline_queue).next,
                         *(curl_llist_element **)&data_local->mstate,msg,
                         (curl_llist_element *)&msg->extmsg);
              k._0_4_ = CURLMSG_NONE;
            }
            else if ((CURLMSG)k == CURLMSG_NONE) {
              k._0_4_ = Curl_add_handle_to_pipeline
                                  ((Curl_easy *)msg,(connectdata *)(msg->list).next);
              pCVar1 = msg;
              if ((CURLMSG)k == CURLMSG_NONE) {
                if ((rc._2_1_ & 1) == CURLM_OK >> 0x10) {
                  k._4_4_ = CURLM_CALL_MULTI_PERFORM;
                  if ((rc._1_1_ & 1) == CURLM_OK >> 8) {
                    if (*(int *)&(msg->list).next[0x4d].prev == 1) {
                      mstate((Curl_easy *)msg,CURLM_STATE_WAITPROXYCONNECT);
                    }
                    else {
                      mstate((Curl_easy *)msg,CURLM_STATE_WAITCONNECT);
                    }
                  }
                  else {
                    _Var2 = Curl_pipeline_wanted((Curl_multi *)data_local,1);
                    CVar7 = CURLM_STATE_DO;
                    if (_Var2) {
                      CVar7 = CURLM_STATE_WAITDO;
                    }
                    mstate((Curl_easy *)pCVar1,CVar7);
                  }
                }
                else {
                  mstate((Curl_easy *)msg,CURLM_STATE_WAITRESOLVE);
                }
              }
              else {
                dns._3_1_ = 1;
              }
            }
            break;
          case CURLMSG_LAST|CURLMSG_DONE:
            conn = (connectdata *)0x0;
            hostname = (char *)(msg->list).next;
            if (((((connectdata *)hostname)->bits).httpproxy & 1U) == 0) {
              if (((((connectdata *)hostname)->bits).conn_to_host & 1U) == 0) {
                wc = (WildcardData *)(((connectdata *)hostname)->host).name;
              }
              else {
                wc = (WildcardData *)(((connectdata *)hostname)->conn_to_host).name;
              }
            }
            else {
              wc = (WildcardData *)(((connectdata *)hostname)->http_proxy).host.name;
            }
            conn = (connectdata *)
                   Curl_fetch_addr((connectdata *)hostname,(char *)wc,
                                   (int)((connectdata *)hostname)->port);
            if (conn != (connectdata *)0x0) {
              k._0_4_ = CURLMSG_NONE;
              Curl_infof((Curl_easy *)msg,"Hostname \'%s\' was found in DNS cache\n",wc);
            }
            if (conn == (connectdata *)0x0) {
              k._0_4_ = 6;
            }
            singlesocket((Curl_multi *)data_local,(Curl_easy *)msg);
            pCVar1 = msg;
            if (conn != (connectdata *)0x0) {
              k._0_4_ = CURLMSG_NONE;
              k._4_4_ = CURLM_CALL_MULTI_PERFORM;
              if ((rc._1_1_ & 1) == CURLM_OK >> 8) {
                if (*(int *)&(msg->list).next[0x4d].prev == 1) {
                  mstate((Curl_easy *)msg,CURLM_STATE_WAITPROXYCONNECT);
                }
                else {
                  mstate((Curl_easy *)msg,CURLM_STATE_WAITCONNECT);
                }
              }
              else {
                _Var2 = Curl_pipeline_wanted((Curl_multi *)data_local,1);
                CVar7 = CURLM_STATE_DO;
                if (_Var2) {
                  CVar7 = CURLM_STATE_WAITDO;
                }
                mstate((Curl_easy *)pCVar1,CVar7);
              }
            }
            if ((CURLMSG)k != CURLMSG_NONE) {
              dns._3_1_ = 1;
            }
            break;
          case 4:
            k._0_4_ = Curl_is_connected((connectdata *)(msg->list).next,0,(_Bool *)((long)&rc + 3));
            if (((rc._3_1_ & 1) == CURLM_OK >> 0x18) || ((CURLMSG)k != CURLMSG_NONE)) {
              if ((CURLMSG)k != CURLMSG_NONE) {
                dns._3_1_ = 1;
              }
            }
            else if (((*(int *)&(msg->list).next[0xf].next == 2) &&
                     (((ulong)(msg->list).next[0x2a].ptr & 0x100) == 0)) ||
                    (*(int *)&(msg->list).next[0x4d].prev == 1)) {
              mstate((Curl_easy *)msg,CURLM_STATE_WAITPROXYCONNECT);
            }
            else {
              k._4_4_ = CURLM_CALL_MULTI_PERFORM;
              CVar7 = CURLM_STATE_SENDPROTOCONNECT;
              if (((ulong)(msg->list).next[0x29].prev & 0x100) != 0) {
                CVar7 = CURLM_STATE_WAITPROXYCONNECT;
              }
              mstate((Curl_easy *)msg,CVar7);
            }
            break;
          case 5:
            k._0_4_ = Curl_http_connect((connectdata *)(msg->list).next,(_Bool *)((long)&rc + 1));
            if (((ulong)(msg->list).next[0x29].next & 0x10000) == 0) {
              if (((CURLMSG)k == CURLMSG_NONE) &&
                 (((*(int *)&(msg->list).next[0xf].next != 2 ||
                   (((ulong)(msg->list).next[0x2a].ptr & 0x100) != 0)) &&
                  (*(int *)&(msg->list).next[0x4d].prev != 1)))) {
                k._4_4_ = CURLM_CALL_MULTI_PERFORM;
                mstate((Curl_easy *)msg,CURLM_STATE_SENDPROTOCONNECT);
              }
            }
            else {
              k._4_4_ = CURLM_CALL_MULTI_PERFORM;
              k._0_4_ = CURLMSG_NONE;
              multi_done((connectdata **)&(msg->list).next,CURLE_OK,false);
              mstate((Curl_easy *)msg,CURLM_STATE_CONNECT);
            }
            break;
          case 6:
            k._0_4_ = Curl_protocol_connect
                                ((connectdata *)(msg->list).next,(_Bool *)((long)&rc + 1));
            pCVar1 = msg;
            if ((rc._1_1_ & 1) == CURLM_OK >> 8) {
              mstate((Curl_easy *)msg,CURLM_STATE_PROTOCONNECT);
            }
            else if ((CURLMSG)k == CURLMSG_NONE) {
              _Var2 = Curl_pipeline_wanted((Curl_multi *)data_local,1);
              CVar7 = CURLM_STATE_DO;
              if (_Var2) {
                CVar7 = CURLM_STATE_WAITDO;
              }
              mstate((Curl_easy *)pCVar1,CVar7);
              k._4_4_ = CURLM_CALL_MULTI_PERFORM;
            }
            else if ((CURLMSG)k != CURLMSG_NONE) {
              Curl_posttransfer((Curl_easy *)msg);
              multi_done((connectdata **)&(msg->list).next,(CURLMSG)k,true);
              dns._3_1_ = 1;
            }
            break;
          case 7:
            k._0_4_ = Curl_protocol_connecting
                                ((connectdata *)(msg->list).next,(_Bool *)((long)&rc + 1));
            pCVar1 = msg;
            if (((CURLMSG)k == CURLMSG_NONE) && ((rc._1_1_ & 1) != CURLM_OK >> 8)) {
              _Var2 = Curl_pipeline_wanted((Curl_multi *)data_local,1);
              CVar7 = CURLM_STATE_DO;
              if (_Var2) {
                CVar7 = CURLM_STATE_WAITDO;
              }
              mstate((Curl_easy *)pCVar1,CVar7);
              k._4_4_ = CURLM_CALL_MULTI_PERFORM;
            }
            else if ((CURLMSG)k != CURLMSG_NONE) {
              Curl_posttransfer((Curl_easy *)msg);
              multi_done((connectdata **)&(msg->list).next,(CURLMSG)k,true);
              dns._3_1_ = 1;
            }
            break;
          case 8:
            _Var2 = Curl_pipeline_checkget_write((Curl_easy *)msg,(connectdata *)(msg->list).next);
            if (_Var2) {
              mstate((Curl_easy *)msg,CURLM_STATE_DO);
              k._4_4_ = CURLM_CALL_MULTI_PERFORM;
            }
            break;
          case 9:
            if (((ulong)msg[0x1f].extmsg.data.whatever & 0x100) == 0) {
              k._0_4_ = multi_do((connectdata **)&(msg->list).next,(_Bool *)&rc);
              if ((CURLMSG)k == CURLMSG_NONE) {
                if (((undefined1)rc & CURLM_BAD_HANDLE) == CURLM_OK) {
                  if ((((ulong)msg[0x2b].list.prev & 1) == 0) ||
                     ((newurl = (char *)&msg[0x1a5].extmsg.easy_handle, *(int *)newurl != 7 &&
                      (*(int *)newurl != 5)))) {
                    mstate((Curl_easy *)msg,CURLM_STATE_DOING);
                    k._4_4_ = CURLM_OK;
                  }
                  else {
                    multi_done((connectdata **)&(msg->list).next,CURLE_OK,false);
                    mstate((Curl_easy *)msg,CURLM_STATE_DONE);
                    k._4_4_ = CURLM_CALL_MULTI_PERFORM;
                  }
                }
                else if (((ulong)(msg->list).next[0x29].ptr & 0x100000000) == 0) {
                  mstate((Curl_easy *)msg,CURLM_STATE_DO_DONE);
                  k._4_4_ = CURLM_CALL_MULTI_PERFORM;
                }
                else {
                  mstate((Curl_easy *)msg,CURLM_STATE_DO_MORE);
                  k._4_4_ = CURLM_OK;
                }
              }
              else if (((CURLMSG)k == 0x37) && (((ulong)(msg->list).next[0x28].next & 0x10000) != 0)
                      ) {
                _drc = (char *)0x0;
                uStack_9c = 0;
                newurl_1._7_1_ = 0;
                local_a0 = Curl_retry_request((connectdata *)(msg->list).next,(char **)&drc);
                if (local_a0 == CURLMSG_NONE) {
                  newurl_1._7_1_ = _drc != (char *)0x0;
                }
                else {
                  dns._3_1_ = 1;
                  k._0_4_ = local_a0;
                }
                Curl_posttransfer((Curl_easy *)msg);
                local_a0 = multi_done((connectdata **)&(msg->list).next,(CURLMSG)k,false);
                if ((newurl_1._7_1_ & 1) == 0) {
                  dns._3_1_ = 1;
                  CVar4 = (CURLMSG)k;
                }
                else if ((local_a0 == CURLMSG_NONE) || (CVar4 = local_a0, local_a0 == 0x37)) {
                  uStack_9c = 2;
                  local_a0 = Curl_follow((Curl_easy *)msg,_drc,FOLLOW_RETRY);
                  CVar4 = local_a0;
                  if (local_a0 == CURLMSG_NONE) {
                    mstate((Curl_easy *)msg,CURLM_STATE_CONNECT);
                    k._4_4_ = CURLM_CALL_MULTI_PERFORM;
                    k._0_4_ = CURLMSG_NONE;
                    CVar4 = (CURLMSG)k;
                  }
                }
                k._0_4_ = CVar4;
                (*Curl_cfree)(_drc);
              }
              else {
                Curl_posttransfer((Curl_easy *)msg);
                if ((msg->list).next != (curl_llist_element *)0x0) {
                  multi_done((connectdata **)&(msg->list).next,(CURLMSG)k,false);
                }
                dns._3_1_ = 1;
              }
            }
            else {
              Curl_conncontrol((connectdata *)(msg->list).next,0);
              mstate((Curl_easy *)msg,CURLM_STATE_DONE);
              k._0_4_ = CURLMSG_NONE;
              k._4_4_ = CURLM_CALL_MULTI_PERFORM;
            }
            break;
          case 10:
            k._0_4_ = Curl_protocol_doing((connectdata *)(msg->list).next,(_Bool *)&rc);
            if ((CURLMSG)k == CURLMSG_NONE) {
              if (((undefined1)rc & CURLM_BAD_HANDLE) != CURLM_OK) {
                CVar7 = CURLM_STATE_DO_DONE;
                if (((ulong)(msg->list).next[0x29].ptr & 0x100000000) != 0) {
                  CVar7 = CURLM_STATE_DO_MORE;
                }
                mstate((Curl_easy *)msg,CVar7);
                k._4_4_ = CURLM_CALL_MULTI_PERFORM;
              }
            }
            else {
              Curl_posttransfer((Curl_easy *)msg);
              multi_done((connectdata **)&(msg->list).next,(CURLMSG)k,false);
              dns._3_1_ = 1;
            }
            break;
          case 0xb:
            k._0_4_ = multi_do_more((connectdata *)(msg->list).next,(int *)((long)&dns + 4));
            if ((CURLMSG)k == CURLMSG_NONE) {
              if (dns._4_4_ == 0) {
                k._4_4_ = CURLM_OK;
              }
              else {
                CVar7 = CURLM_STATE_DOING;
                if (dns._4_4_ == 1) {
                  CVar7 = CURLM_STATE_DO_DONE;
                }
                mstate((Curl_easy *)msg,CVar7);
                k._4_4_ = CURLM_CALL_MULTI_PERFORM;
              }
            }
            else {
              Curl_posttransfer((Curl_easy *)msg);
              multi_done((connectdata **)&(msg->list).next,(CURLMSG)k,false);
              dns._3_1_ = 1;
            }
            break;
          case 0xc:
            Curl_move_handle_from_send_to_recv_pipe
                      ((Curl_easy *)msg,(connectdata *)(msg->list).next);
            Curl_multi_process_pending_handles((Curl_multi *)data_local);
            if ((*(int *)&(msg->list).next[0x2c].next == -1) &&
               (*(int *)((long)&(msg->list).next[0x2c].next + 4) == -1)) {
              mstate((Curl_easy *)msg,CURLM_STATE_DONE);
            }
            else {
              mstate((Curl_easy *)msg,CURLM_STATE_WAITPERFORM);
            }
            k._4_4_ = CURLM_CALL_MULTI_PERFORM;
            break;
          case 0xd:
            _Var2 = Curl_pipeline_checkget_read((Curl_easy *)msg,(connectdata *)(msg->list).next);
            if (_Var2) {
              mstate((Curl_easy *)msg,CURLM_STATE_PERFORM);
              k._4_4_ = CURLM_CALL_MULTI_PERFORM;
            }
            break;
          case 0xe:
            _ret = (curl_llist_element *)0x0;
            follow_1._3_1_ = FOLLOW_NONE >> 0x18;
            follow_1._2_1_ = FOLLOW_NONE >> 0x10;
            lStack_68 = 0;
            if (0 < (long)msg[0x12].list.next) {
              now_02.tv_usec = now_local.tv_sec;
              now_02.tv_sec = (__time_t)multi_local;
              lStack_68 = Curl_pgrsLimitWaitTime
                                    ((curl_off_t)msg[0x30].list.ptr,
                                     (curl_off_t)msg[0x33].extmsg.data,
                                     (curl_off_t)msg[0x12].list.next,*(timeval *)&msg[0x33].extmsg,
                                     now_02);
            }
            send_timeout_ms = 0;
            if (0 < *(long *)&msg[0x12].extmsg) {
              start_00.tv_sec = (__time_t)msg[0x34].list.ptr;
              start_00.tv_usec = (__suseconds_t)msg[0x34].list.prev;
              now_03.tv_usec = now_local.tv_sec;
              now_03.tv_sec = (__time_t)multi_local;
              send_timeout_ms =
                   Curl_pgrsLimitWaitTime
                             ((curl_off_t)msg[0x2f].extmsg.data,(curl_off_t)msg[0x34].list.next,
                              *(curl_off_t *)&msg[0x12].extmsg,start_00,now_03);
            }
            if ((lStack_68 < 1) && (send_timeout_ms < 1)) {
              k._0_4_ = Curl_readwrite((connectdata *)(msg->list).next,(Curl_easy *)msg,
                                       (_Bool *)((long)&result + 3),(_Bool *)((long)&follow_1 + 2));
              timeout_ms = (time_t)(msg + 4);
              if (((ulong)msg[9].list.ptr & 0x100000000) == 0) {
                Curl_pipeline_leave_read((connectdata *)(msg->list).next);
              }
              if ((*(uint *)(timeout_ms + 0xf4) & 2) == 0) {
                Curl_pipeline_leave_write((connectdata *)(msg->list).next);
              }
              if (((result._3_1_ & 1) != CURLE_OK >> 0x18) || ((CURLMSG)k == 0x38)) {
                CVar3 = Curl_retry_request((connectdata *)(msg->list).next,(char **)&ret);
                if (CVar3 == CURLE_OK) {
                  follow_1._3_1_ = _ret != (curl_llist_element *)0x0;
                }
                if ((follow_1._3_1_ & 1) != FOLLOW_NONE >> 0x18) {
                  k._0_4_ = CURLMSG_NONE;
                  result._3_1_ = 1;
                }
              }
              if ((CURLMSG)k == CURLMSG_NONE) {
                if ((result._3_1_ & 1) == CURLE_OK >> 0x18) {
                  if ((follow_1._2_1_ & 1) != FOLLOW_NONE >> 0x10) {
                    k._4_4_ = CURLM_CALL_MULTI_PERFORM;
                  }
                }
                else {
                  Curl_posttransfer((Curl_easy *)msg);
                  Curl_removeHandleFromPipeline
                            ((Curl_easy *)msg,(curl_llist *)((msg->list).next + 0x32));
                  if ((msg->list).next[0x32].ptr != (void *)0x0) {
                    Curl_expire(*(msg->list).next[0x32].ptr,0,EXPIRE_RUN_NOW);
                  }
                  Curl_multi_process_pending_handles((Curl_multi *)data_local);
                  if ((*(long *)&msg[9].extmsg == 0) &&
                     ((follow_1._3_1_ & 1) == FOLLOW_NONE >> 0x18)) {
                    if (msg[9].list.next != (curl_llist_element *)0x0) {
                      (*Curl_cfree)(_ret);
                      _ret = msg[9].list.next;
                      msg[9].list.next = (curl_llist_element *)0x0;
                      k._0_4_ = Curl_follow((Curl_easy *)msg,(char *)_ret,FOLLOW_FAKE);
                      if ((CURLMSG)k != CURLMSG_NONE) {
                        dns._3_1_ = 1;
                      }
                    }
                    mstate((Curl_easy *)msg,CURLM_STATE_DONE);
                    k._4_4_ = CURLM_CALL_MULTI_PERFORM;
                  }
                  else {
                    if ((follow_1._3_1_ & 1) == FOLLOW_NONE >> 0x18) {
                      (*Curl_cfree)(_ret);
                      _ret = *(curl_llist_element **)&msg[9].extmsg;
                      *(undefined8 *)&msg[9].extmsg = 0;
                      fStack_bc = FOLLOW_REDIR;
                    }
                    else {
                      fStack_bc = FOLLOW_RETRY;
                    }
                    k._0_4_ = multi_done((connectdata **)&(msg->list).next,CURLE_OK,false);
                    if (((CURLMSG)k == CURLMSG_NONE) &&
                       (k._0_4_ = Curl_follow((Curl_easy *)msg,(char *)_ret,fStack_bc),
                       (CURLMSG)k == CURLMSG_NONE)) {
                      mstate((Curl_easy *)msg,CURLM_STATE_CONNECT);
                      k._4_4_ = CURLM_CALL_MULTI_PERFORM;
                    }
                  }
                }
              }
              else {
                if ((((ulong)(msg->list).next[0x2b].next[5].ptr & 0x200000000) == 0) &&
                   ((CURLMSG)k != 0x5c)) {
                  Curl_conncontrol((connectdata *)(msg->list).next,2);
                }
                Curl_posttransfer((Curl_easy *)msg);
                multi_done((connectdata **)&(msg->list).next,(CURLMSG)k,true);
              }
              (*Curl_cfree)(_ret);
            }
            else {
              mstate((Curl_easy *)msg,CURLM_STATE_TOOFAST);
              if (lStack_68 < send_timeout_ms) {
                Curl_expire((Curl_easy *)msg,send_timeout_ms,EXPIRE_TOOFAST);
              }
              else {
                Curl_expire((Curl_easy *)msg,lStack_68,EXPIRE_TOOFAST);
              }
            }
            break;
          case 0xf:
            iVar5 = Curl_pgrsUpdate((connectdata *)(msg->list).next);
            if (iVar5 == 0) {
              now_04.tv_usec = now_local.tv_sec;
              now_04.tv_sec = (__time_t)multi_local;
              k._0_4_ = Curl_speedcheck((Curl_easy *)msg,now_04);
            }
            else {
              k._0_4_ = 0x2a;
            }
            if ((CURLMSG)k == CURLMSG_NONE) {
              lStack_68 = 0;
              if (0 < (long)msg[0x12].list.next) {
                now_00.tv_usec = now_local.tv_sec;
                now_00.tv_sec = (__time_t)multi_local;
                lStack_68 = Curl_pgrsLimitWaitTime
                                      ((curl_off_t)msg[0x30].list.ptr,
                                       (curl_off_t)msg[0x33].extmsg.data,
                                       (curl_off_t)msg[0x12].list.next,*(timeval *)&msg[0x33].extmsg
                                       ,now_00);
              }
              send_timeout_ms = 0;
              if (0 < *(long *)&msg[0x12].extmsg) {
                start.tv_sec = (__time_t)msg[0x34].list.ptr;
                start.tv_usec = (__suseconds_t)msg[0x34].list.prev;
                now_01.tv_usec = now_local.tv_sec;
                now_01.tv_sec = (__time_t)multi_local;
                send_timeout_ms =
                     Curl_pgrsLimitWaitTime
                               ((curl_off_t)msg[0x2f].extmsg.data,(curl_off_t)msg[0x34].list.next,
                                *(curl_off_t *)&msg[0x12].extmsg,start,now_01);
              }
              if ((lStack_68 < 1) && (send_timeout_ms < 1)) {
                mstate((Curl_easy *)msg,CURLM_STATE_PERFORM);
              }
              else if (lStack_68 < send_timeout_ms) {
                Curl_expire((Curl_easy *)msg,send_timeout_ms,EXPIRE_TOOFAST);
              }
              else {
                Curl_expire((Curl_easy *)msg,lStack_68,EXPIRE_TOOFAST);
              }
            }
            break;
          case 0x10:
            k._4_4_ = CURLM_CALL_MULTI_PERFORM;
            if ((msg->list).next != (curl_llist_element *)0x0) {
              Curl_removeHandleFromPipeline
                        ((Curl_easy *)msg,(curl_llist *)((msg->list).next + 0x32));
              Curl_multi_process_pending_handles((Curl_multi *)data_local);
              CVar4 = multi_done((connectdata **)&(msg->list).next,(CURLMSG)k,false);
              if ((CURLMSG)k == CURLMSG_NONE) {
                k._0_4_ = CVar4;
              }
              if ((msg->list).next != (curl_llist_element *)0x0) {
                (msg->list).next = (curl_llist_element *)0x0;
              }
            }
            if ((((ulong)msg[0x2b].list.prev & 1) == 0) ||
               (*(int *)&msg[0x1a5].extmsg.easy_handle == 7)) {
              mstate((Curl_easy *)msg,CURLM_STATE_COMPLETED);
            }
            else {
              mstate((Curl_easy *)msg,CURLM_STATE_INIT);
            }
            break;
          case 0x11:
            (msg->list).next = (curl_llist_element *)0x0;
            Curl_expire_clear((Curl_easy *)msg);
            break;
          case 0x12:
            *(CURLMSG *)&msg[1].extmsg.field_0x4 = (CURLMSG)k;
            return CURLM_OK;
          default:
            return CURLM_INTERNAL_ERROR;
          }
        }
        else {
          if (msg[1].extmsg.msg == (CURLMSG_LAST|CURLMSG_DONE)) {
            newer.tv_usec = now_local.tv_sec;
            newer.tv_sec = (__time_t)multi_local;
            tVar6 = curlx_tvdiff(newer,*(timeval *)&msg[0x32].extmsg);
            Curl_failf((Curl_easy *)pCVar1,"Resolving timed out after %ld milliseconds",tVar6);
          }
          else if (msg[1].extmsg.msg == 4) {
            newer_00.tv_usec = now_local.tv_sec;
            newer_00.tv_sec = (__time_t)multi_local;
            tVar6 = curlx_tvdiff(newer_00,*(timeval *)&msg[0x32].extmsg);
            Curl_failf((Curl_easy *)pCVar1,"Connection timed out after %ld milliseconds",tVar6);
          }
          else {
            timeout_ms = (time_t)(msg + 4);
            if ((((Curl_message *)timeout_ms)->list).ptr == (void *)0xffffffffffffffff) {
              newer_02.tv_usec = now_local.tv_sec;
              newer_02.tv_sec = (__time_t)multi_local;
              tVar6 = curlx_tvdiff(newer_02,*(timeval *)&msg[0x32].extmsg);
              Curl_failf((Curl_easy *)pCVar1,
                         "Operation timed out after %ld milliseconds with %ld bytes received",tVar6,
                         *(undefined8 *)(timeout_ms + 0x20));
            }
            else {
              newer_01.tv_usec = now_local.tv_sec;
              newer_01.tv_sec = (__time_t)multi_local;
              tVar6 = curlx_tvdiff(newer_01,*(timeval *)&msg[0x32].extmsg);
              Curl_failf((Curl_easy *)pCVar1,
                         "Operation timed out after %ld milliseconds with %ld out of %ld bytes received"
                         ,tVar6,*(undefined8 *)(timeout_ms + 0x20),*(undefined8 *)timeout_ms);
            }
          }
          if (9 < msg[1].extmsg.msg) {
            Curl_conncontrol((connectdata *)(msg->list).next,2);
            dns._3_1_ = 1;
          }
          k._0_4_ = 0x1c;
          multi_done((connectdata **)&(msg->list).next,CURLE_OPERATION_TIMEDOUT,true);
        }
        if (msg[1].extmsg.msg < 0x11) {
          if ((CURLMSG)k == CURLMSG_NONE) {
            if (((msg->list).next != (curl_llist_element *)0x0) &&
               (iVar5 = Curl_pgrsUpdate((connectdata *)(msg->list).next), iVar5 != 0)) {
              k._0_4_ = 0x2a;
              Curl_conncontrol((connectdata *)(msg->list).next,2);
              CVar7 = CURLM_STATE_COMPLETED;
              if (msg[1].extmsg.msg < 0x10) {
                CVar7 = CURLM_STATE_DONE;
              }
              mstate((Curl_easy *)msg,CVar7);
              k._4_4_ = CURLM_CALL_MULTI_PERFORM;
            }
          }
          else {
            *(byte *)((long)&msg[0x1a2].extmsg.data.result + 1) = 0;
            Curl_multi_process_pending_handles((Curl_multi *)data_local);
            if ((msg->list).next == (curl_llist_element *)0x0) {
              if (msg[1].extmsg.msg == CURLMSG_LAST) {
                Curl_posttransfer((Curl_easy *)msg);
              }
            }
            else {
              Curl_pipeline_leave_write((connectdata *)(msg->list).next);
              Curl_pipeline_leave_read((connectdata *)(msg->list).next);
              Curl_removeHandleFromPipeline
                        ((Curl_easy *)msg,(curl_llist *)&(msg->list).next[0x30].next);
              Curl_removeHandleFromPipeline
                        ((Curl_easy *)msg,(curl_llist *)((msg->list).next + 0x32));
              if ((dns._3_1_ & 1) != 0) {
                Curl_disconnect((connectdata *)(msg->list).next,(CURLMSG)k == 0x1c);
                (msg->list).next = (curl_llist_element *)0x0;
              }
            }
            mstate((Curl_easy *)msg,CURLM_STATE_COMPLETED);
          }
        }
        if (msg[1].extmsg.msg == 0x11) {
          ppCStack_38 = &msg[1].extmsg.easy_handle;
          *(undefined4 *)&msg[2].list.prev = 1;
          msg[2].list.next = &msg->list;
          msg[2].extmsg.msg = (CURLMSG)k;
          k._4_4_ = multi_addmsg((Curl_multi *)data_local,(Curl_message *)ppCStack_38);
          mstate((Curl_easy *)msg,CURLM_STATE_MSGSENT);
        }
      }
      else {
        Curl_infof((Curl_easy *)msg,"Pipe broke: handle %p, url = %s\n",msg,msg[0x1a3].list.next);
        if (msg[1].extmsg.msg < 0x11) {
          mstate((Curl_easy *)msg,CURLM_STATE_CONNECT);
          k._4_4_ = CURLM_CALL_MULTI_PERFORM;
          k._0_4_ = CURLMSG_NONE;
        }
        *(byte *)((long)&msg[0x1a2].extmsg.data.result + 1) = 0;
        (msg->list).next = (curl_llist_element *)0x0;
      }
      local_111 = true;
      if (k._4_4_ != CURLM_CALL_MULTI_PERFORM) {
        local_111 = multi_ischanged((Curl_multi *)data_local,false);
      }
    } while (local_111 != false);
    *(CURLMSG *)&msg[1].extmsg.field_0x4 = (CURLMSG)k;
    now_local.tv_usec._4_4_ = k._4_4_;
  }
  return now_local.tv_usec._4_4_;
}

Assistant:

static CURLMcode multi_runsingle(struct Curl_multi *multi,
                                 struct timeval now,
                                 struct Curl_easy *data)
{
  struct Curl_message *msg = NULL;
  bool connected;
  bool async;
  bool protocol_connect = FALSE;
  bool dophase_done = FALSE;
  bool done = FALSE;
  CURLMcode rc;
  CURLcode result = CURLE_OK;
  struct SingleRequest *k;
  time_t timeout_ms;
  time_t recv_timeout_ms;
  time_t send_timeout_ms;
  int control;

  if(!GOOD_EASY_HANDLE(data))
    return CURLM_BAD_EASY_HANDLE;

  do {
    /* A "stream" here is a logical stream if the protocol can handle that
       (HTTP/2), or the full connection for older protocols */
    bool stream_error = FALSE;
    rc = CURLM_OK;

    /* Handle the case when the pipe breaks, i.e., the connection
       we're using gets cleaned up and we're left with nothing. */
    if(data->state.pipe_broke) {
      infof(data, "Pipe broke: handle %p, url = %s\n",
            (void *)data, data->state.path);

      if(data->mstate < CURLM_STATE_COMPLETED) {
        /* Head back to the CONNECT state */
        multistate(data, CURLM_STATE_CONNECT);
        rc = CURLM_CALL_MULTI_PERFORM;
        result = CURLE_OK;
      }

      data->state.pipe_broke = FALSE;
      data->easy_conn = NULL;
      continue;
    }

    if(!data->easy_conn &&
       data->mstate > CURLM_STATE_CONNECT &&
       data->mstate < CURLM_STATE_DONE) {
      /* In all these states, the code will blindly access 'data->easy_conn'
         so this is precaution that it isn't NULL. And it silences static
         analyzers. */
      failf(data, "In state %d with no easy_conn, bail out!\n", data->mstate);
      return CURLM_INTERNAL_ERROR;
    }

    if(multi_ischanged(multi, TRUE)) {
      DEBUGF(infof(data, "multi changed, check CONNECT_PEND queue!\n"));
      Curl_multi_process_pending_handles(multi);
    }

    if(data->easy_conn && data->mstate > CURLM_STATE_CONNECT &&
       data->mstate < CURLM_STATE_COMPLETED)
      /* Make sure we set the connection's current owner */
      data->easy_conn->data = data;

    if(data->easy_conn &&
       (data->mstate >= CURLM_STATE_CONNECT) &&
       (data->mstate < CURLM_STATE_COMPLETED)) {
      /* we need to wait for the connect state as only then is the start time
         stored, but we must not check already completed handles */

      timeout_ms = Curl_timeleft(data, &now,
                                 (data->mstate <= CURLM_STATE_WAITDO)?
                                 TRUE:FALSE);

      if(timeout_ms < 0) {
        /* Handle timed out */
        if(data->mstate == CURLM_STATE_WAITRESOLVE)
          failf(data, "Resolving timed out after %ld milliseconds",
                Curl_tvdiff(now, data->progress.t_startsingle));
        else if(data->mstate == CURLM_STATE_WAITCONNECT)
          failf(data, "Connection timed out after %ld milliseconds",
                Curl_tvdiff(now, data->progress.t_startsingle));
        else {
          k = &data->req;
          if(k->size != -1) {
            failf(data, "Operation timed out after %ld milliseconds with %"
                  CURL_FORMAT_CURL_OFF_T " out of %"
                  CURL_FORMAT_CURL_OFF_T " bytes received",
                  Curl_tvdiff(now, data->progress.t_startsingle),
                  k->bytecount, k->size);
          }
          else {
            failf(data, "Operation timed out after %ld milliseconds with %"
                  CURL_FORMAT_CURL_OFF_T " bytes received",
                  Curl_tvdiff(now, data->progress.t_startsingle),
                  k->bytecount);
          }
        }

        /* Force connection closed if the connection has indeed been used */
        if(data->mstate > CURLM_STATE_DO) {
          streamclose(data->easy_conn, "Disconnected with pending data");
          stream_error = TRUE;
        }
        result = CURLE_OPERATION_TIMEDOUT;
        (void)multi_done(&data->easy_conn, result, TRUE);
        /* Skip the statemachine and go directly to error handling section. */
        goto statemachine_end;
      }
    }

    switch(data->mstate) {
    case CURLM_STATE_INIT:
      /* init this transfer. */
      result=Curl_pretransfer(data);

      if(!result) {
        /* after init, go CONNECT */
        multistate(data, CURLM_STATE_CONNECT);
        Curl_pgrsTime(data, TIMER_STARTOP);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      break;

    case CURLM_STATE_CONNECT_PEND:
      /* We will stay here until there is a connection available. Then
         we try again in the CURLM_STATE_CONNECT state. */
      break;

    case CURLM_STATE_CONNECT:
      /* Connect. We want to get a connection identifier filled in. */
      Curl_pgrsTime(data, TIMER_STARTSINGLE);
      result = Curl_connect(data, &data->easy_conn,
                            &async, &protocol_connect);
      if(CURLE_NO_CONNECTION_AVAILABLE == result) {
        /* There was no connection available. We will go to the pending
           state and wait for an available connection. */
        multistate(data, CURLM_STATE_CONNECT_PEND);

        /* add this handle to the list of connect-pending handles */
        Curl_llist_insert_next(&multi->pending, multi->pending.tail, data,
                               &data->connect_queue);
        result = CURLE_OK;
        break;
      }

      if(!result) {
        /* Add this handle to the send or pend pipeline */
        result = Curl_add_handle_to_pipeline(data, data->easy_conn);
        if(result)
          stream_error = TRUE;
        else {
          if(async)
            /* We're now waiting for an asynchronous name lookup */
            multistate(data, CURLM_STATE_WAITRESOLVE);
          else {
            /* after the connect has been sent off, go WAITCONNECT unless the
               protocol connect is already done and we can go directly to
               WAITDO or DO! */
            rc = CURLM_CALL_MULTI_PERFORM;

            if(protocol_connect)
              multistate(data, Curl_pipeline_wanted(multi, CURLPIPE_HTTP1)?
                         CURLM_STATE_WAITDO:CURLM_STATE_DO);
            else {
#ifndef CURL_DISABLE_HTTP
              if(data->easy_conn->tunnel_state[FIRSTSOCKET] == TUNNEL_CONNECT)
                multistate(data, CURLM_STATE_WAITPROXYCONNECT);
              else
#endif
                multistate(data, CURLM_STATE_WAITCONNECT);
            }
          }
        }
      }
      break;

    case CURLM_STATE_WAITRESOLVE:
      /* awaiting an asynch name resolve to complete */
    {
      struct Curl_dns_entry *dns = NULL;
      struct connectdata *conn = data->easy_conn;
      const char *hostname;

      if(conn->bits.httpproxy)
        hostname = conn->http_proxy.host.name;
      else if(conn->bits.conn_to_host)
        hostname = conn->conn_to_host.name;
      else
        hostname = conn->host.name;

      /* check if we have the name resolved by now */
      dns = Curl_fetch_addr(conn, hostname, (int)conn->port);

      if(dns) {
#ifdef CURLRES_ASYNCH
        conn->async.dns = dns;
        conn->async.done = TRUE;
#endif
        result = CURLE_OK;
        infof(data, "Hostname '%s' was found in DNS cache\n", hostname);
      }

      if(!dns)
        result = Curl_resolver_is_resolved(data->easy_conn, &dns);

      /* Update sockets here, because the socket(s) may have been
         closed and the application thus needs to be told, even if it
         is likely that the same socket(s) will again be used further
         down.  If the name has not yet been resolved, it is likely
         that new sockets have been opened in an attempt to contact
         another resolver. */
      singlesocket(multi, data);

      if(dns) {
        /* Perform the next step in the connection phase, and then move on
           to the WAITCONNECT state */
        result = Curl_async_resolved(data->easy_conn, &protocol_connect);

        if(result)
          /* if Curl_async_resolved() returns failure, the connection struct
             is already freed and gone */
          data->easy_conn = NULL;           /* no more connection */
        else {
          /* call again please so that we get the next socket setup */
          rc = CURLM_CALL_MULTI_PERFORM;
          if(protocol_connect)
            multistate(data, Curl_pipeline_wanted(multi, CURLPIPE_HTTP1)?
                       CURLM_STATE_WAITDO:CURLM_STATE_DO);
          else {
#ifndef CURL_DISABLE_HTTP
            if(data->easy_conn->tunnel_state[FIRSTSOCKET] == TUNNEL_CONNECT)
              multistate(data, CURLM_STATE_WAITPROXYCONNECT);
            else
#endif
              multistate(data, CURLM_STATE_WAITCONNECT);
          }
        }
      }

      if(result) {
        /* failure detected */
        stream_error = TRUE;
        break;
      }
    }
    break;

#ifndef CURL_DISABLE_HTTP
    case CURLM_STATE_WAITPROXYCONNECT:
      /* this is HTTP-specific, but sending CONNECT to a proxy is HTTP... */
      result = Curl_http_connect(data->easy_conn, &protocol_connect);

      if(data->easy_conn->bits.proxy_connect_closed) {
        rc = CURLM_CALL_MULTI_PERFORM;
        /* connect back to proxy again */
        result = CURLE_OK;
        multi_done(&data->easy_conn, CURLE_OK, FALSE);
        multistate(data, CURLM_STATE_CONNECT);
      }
      else if(!result) {
        if((data->easy_conn->http_proxy.proxytype != CURLPROXY_HTTPS ||
           data->easy_conn->bits.proxy_ssl_connected[FIRSTSOCKET]) &&
           (data->easy_conn->tunnel_state[FIRSTSOCKET] != TUNNEL_CONNECT)) {
          rc = CURLM_CALL_MULTI_PERFORM;
          /* initiate protocol connect phase */
          multistate(data, CURLM_STATE_SENDPROTOCONNECT);
        }
      }
      break;
#endif

    case CURLM_STATE_WAITCONNECT:
      /* awaiting a completion of an asynch TCP connect */
      result = Curl_is_connected(data->easy_conn, FIRSTSOCKET, &connected);
      if(connected && !result) {
#ifndef CURL_DISABLE_HTTP
        if((data->easy_conn->http_proxy.proxytype == CURLPROXY_HTTPS &&
            !data->easy_conn->bits.proxy_ssl_connected[FIRSTSOCKET]) ||
            (data->easy_conn->tunnel_state[FIRSTSOCKET] == TUNNEL_CONNECT)) {
          multistate(data, CURLM_STATE_WAITPROXYCONNECT);
          break;
        }
#endif
        rc = CURLM_CALL_MULTI_PERFORM;
        multistate(data, data->easy_conn->bits.tunnel_proxy?
                   CURLM_STATE_WAITPROXYCONNECT:
                   CURLM_STATE_SENDPROTOCONNECT);
      }
      else if(result) {
        /* failure detected */
        /* Just break, the cleaning up is handled all in one place */
        stream_error = TRUE;
        break;
      }
      break;

    case CURLM_STATE_SENDPROTOCONNECT:
      result = Curl_protocol_connect(data->easy_conn, &protocol_connect);
      if(!protocol_connect)
        /* switch to waiting state */
        multistate(data, CURLM_STATE_PROTOCONNECT);
      else if(!result) {
        /* protocol connect has completed, go WAITDO or DO */
        multistate(data, Curl_pipeline_wanted(multi, CURLPIPE_HTTP1)?
                   CURLM_STATE_WAITDO:CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else if(result) {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, TRUE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_PROTOCONNECT:
      /* protocol-specific connect phase */
      result = Curl_protocol_connecting(data->easy_conn, &protocol_connect);
      if(!result && protocol_connect) {
        /* after the connect has completed, go WAITDO or DO */
        multistate(data, Curl_pipeline_wanted(multi, CURLPIPE_HTTP1)?
                   CURLM_STATE_WAITDO:CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else if(result) {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, TRUE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_WAITDO:
      /* Wait for our turn to DO when we're pipelining requests */
      if(Curl_pipeline_checkget_write(data, data->easy_conn)) {
        /* Grabbed the channel */
        multistate(data, CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      break;

    case CURLM_STATE_DO:
      if(data->set.connect_only) {
        /* keep connection open for application to use the socket */
        connkeep(data->easy_conn, "CONNECT_ONLY");
        multistate(data, CURLM_STATE_DONE);
        result = CURLE_OK;
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else {
        /* Perform the protocol's DO action */
        result = multi_do(&data->easy_conn, &dophase_done);

        /* When multi_do() returns failure, data->easy_conn might be NULL! */

        if(!result) {
          if(!dophase_done) {
            /* some steps needed for wildcard matching */
            if(data->set.wildcardmatch) {
              struct WildcardData *wc = &data->wildcard;
              if(wc->state == CURLWC_DONE || wc->state == CURLWC_SKIP) {
                /* skip some states if it is important */
                multi_done(&data->easy_conn, CURLE_OK, FALSE);
                multistate(data, CURLM_STATE_DONE);
                rc = CURLM_CALL_MULTI_PERFORM;
                break;
              }
            }
            /* DO was not completed in one function call, we must continue
               DOING... */
            multistate(data, CURLM_STATE_DOING);
            rc = CURLM_OK;
          }

          /* after DO, go DO_DONE... or DO_MORE */
          else if(data->easy_conn->bits.do_more) {
            /* we're supposed to do more, but we need to sit down, relax
               and wait a little while first */
            multistate(data, CURLM_STATE_DO_MORE);
            rc = CURLM_OK;
          }
          else {
            /* we're done with the DO, now DO_DONE */
            multistate(data, CURLM_STATE_DO_DONE);
            rc = CURLM_CALL_MULTI_PERFORM;
          }
        }
        else if((CURLE_SEND_ERROR == result) &&
                data->easy_conn->bits.reuse) {
          /*
           * In this situation, a connection that we were trying to use
           * may have unexpectedly died.  If possible, send the connection
           * back to the CONNECT phase so we can try again.
           */
          char *newurl = NULL;
          followtype follow=FOLLOW_NONE;
          CURLcode drc;
          bool retry = FALSE;

          drc = Curl_retry_request(data->easy_conn, &newurl);
          if(drc) {
            /* a failure here pretty much implies an out of memory */
            result = drc;
            stream_error = TRUE;
          }
          else
            retry = (newurl)?TRUE:FALSE;

          Curl_posttransfer(data);
          drc = multi_done(&data->easy_conn, result, FALSE);

          /* When set to retry the connection, we must to go back to
           * the CONNECT state */
          if(retry) {
            if(!drc || (drc == CURLE_SEND_ERROR)) {
              follow = FOLLOW_RETRY;
              drc = Curl_follow(data, newurl, follow);
              if(!drc) {
                multistate(data, CURLM_STATE_CONNECT);
                rc = CURLM_CALL_MULTI_PERFORM;
                result = CURLE_OK;
              }
              else {
                /* Follow failed */
                result = drc;
              }
            }
            else {
              /* done didn't return OK or SEND_ERROR */
              result = drc;
            }
          }
          else {
            /* Have error handler disconnect conn if we can't retry */
            stream_error = TRUE;
          }
          free(newurl);
        }
        else {
          /* failure detected */
          Curl_posttransfer(data);
          if(data->easy_conn)
            multi_done(&data->easy_conn, result, FALSE);
          stream_error = TRUE;
        }
      }
      break;

    case CURLM_STATE_DOING:
      /* we continue DOING until the DO phase is complete */
      result = Curl_protocol_doing(data->easy_conn,
                                   &dophase_done);
      if(!result) {
        if(dophase_done) {
          /* after DO, go DO_DONE or DO_MORE */
          multistate(data, data->easy_conn->bits.do_more?
                     CURLM_STATE_DO_MORE:
                     CURLM_STATE_DO_DONE);
          rc = CURLM_CALL_MULTI_PERFORM;
        } /* dophase_done */
      }
      else {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, FALSE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_DO_MORE:
      /*
       * When we are connected, DO MORE and then go DO_DONE
       */
      result = multi_do_more(data->easy_conn, &control);

      /* No need to remove this handle from the send pipeline here since that
         is done in multi_done() */
      if(!result) {
        if(control) {
          /* if positive, advance to DO_DONE
             if negative, go back to DOING */
          multistate(data, control==1?
                     CURLM_STATE_DO_DONE:
                     CURLM_STATE_DOING);
          rc = CURLM_CALL_MULTI_PERFORM;
        }
        else
          /* stay in DO_MORE */
          rc = CURLM_OK;
      }
      else {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, FALSE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_DO_DONE:
      /* Move ourselves from the send to recv pipeline */
      Curl_move_handle_from_send_to_recv_pipe(data, data->easy_conn);
      /* Check if we can move pending requests to send pipe */
      Curl_multi_process_pending_handles(multi);

      /* Only perform the transfer if there's a good socket to work with.
         Having both BAD is a signal to skip immediately to DONE */
      if((data->easy_conn->sockfd != CURL_SOCKET_BAD) ||
         (data->easy_conn->writesockfd != CURL_SOCKET_BAD))
        multistate(data, CURLM_STATE_WAITPERFORM);
      else
        multistate(data, CURLM_STATE_DONE);
      rc = CURLM_CALL_MULTI_PERFORM;
      break;

    case CURLM_STATE_WAITPERFORM:
      /* Wait for our turn to PERFORM */
      if(Curl_pipeline_checkget_read(data, data->easy_conn)) {
        /* Grabbed the channel */
        multistate(data, CURLM_STATE_PERFORM);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      break;

    case CURLM_STATE_TOOFAST: /* limit-rate exceeded in either direction */
      /* if both rates are within spec, resume transfer */
      if(Curl_pgrsUpdate(data->easy_conn))
        result = CURLE_ABORTED_BY_CALLBACK;
      else
        result = Curl_speedcheck(data, now);

      if(!result) {
        send_timeout_ms = 0;
        if(data->set.max_send_speed > 0)
          send_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.uploaded,
                                data->progress.ul_limit_size,
                                data->set.max_send_speed,
                                data->progress.ul_limit_start,
                                now);

        recv_timeout_ms = 0;
        if(data->set.max_recv_speed > 0)
          recv_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.downloaded,
                                data->progress.dl_limit_size,
                                data->set.max_recv_speed,
                                data->progress.dl_limit_start,
                                now);

        if(send_timeout_ms <= 0 && recv_timeout_ms <= 0)
          multistate(data, CURLM_STATE_PERFORM);
        else if(send_timeout_ms >= recv_timeout_ms)
          Curl_expire(data, send_timeout_ms, EXPIRE_TOOFAST);
        else
          Curl_expire(data, recv_timeout_ms, EXPIRE_TOOFAST);
      }
      break;

    case CURLM_STATE_PERFORM:
    {
      char *newurl = NULL;
      bool retry = FALSE;
      bool comeback = FALSE;

      /* check if over send speed */
      send_timeout_ms = 0;
      if(data->set.max_send_speed > 0)
        send_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.uploaded,
                                                 data->progress.ul_limit_size,
                                                 data->set.max_send_speed,
                                                 data->progress.ul_limit_start,
                                                 now);

      /* check if over recv speed */
      recv_timeout_ms = 0;
      if(data->set.max_recv_speed > 0)
        recv_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.downloaded,
                                                 data->progress.dl_limit_size,
                                                 data->set.max_recv_speed,
                                                 data->progress.dl_limit_start,
                                                 now);

      if(send_timeout_ms > 0 || recv_timeout_ms > 0) {
        multistate(data, CURLM_STATE_TOOFAST);
        if(send_timeout_ms >= recv_timeout_ms)
          Curl_expire(data, send_timeout_ms, EXPIRE_TOOFAST);
        else
          Curl_expire(data, recv_timeout_ms, EXPIRE_TOOFAST);
        break;
      }

      /* read/write data if it is ready to do so */
      result = Curl_readwrite(data->easy_conn, data, &done, &comeback);

      k = &data->req;

      if(!(k->keepon & KEEP_RECV))
        /* We're done receiving */
        Curl_pipeline_leave_read(data->easy_conn);

      if(!(k->keepon & KEEP_SEND))
        /* We're done sending */
        Curl_pipeline_leave_write(data->easy_conn);

      if(done || (result == CURLE_RECV_ERROR)) {
        /* If CURLE_RECV_ERROR happens early enough, we assume it was a race
         * condition and the server closed the re-used connection exactly when
         * we wanted to use it, so figure out if that is indeed the case.
         */
        CURLcode ret = Curl_retry_request(data->easy_conn, &newurl);
        if(!ret)
          retry = (newurl)?TRUE:FALSE;

        if(retry) {
          /* if we are to retry, set the result to OK and consider the
             request as done */
          result = CURLE_OK;
          done = TRUE;
        }
      }

      if(result) {
        /*
         * The transfer phase returned error, we mark the connection to get
         * closed to prevent being re-used. This is because we can't possibly
         * know if the connection is in a good shape or not now.  Unless it is
         * a protocol which uses two "channels" like FTP, as then the error
         * happened in the data connection.
         */

        if(!(data->easy_conn->handler->flags & PROTOPT_DUAL) &&
           result != CURLE_HTTP2_STREAM)
          streamclose(data->easy_conn, "Transfer returned error");

        Curl_posttransfer(data);
        multi_done(&data->easy_conn, result, TRUE);
      }
      else if(done) {
        followtype follow=FOLLOW_NONE;

        /* call this even if the readwrite function returned error */
        Curl_posttransfer(data);

        /* we're no longer receiving */
        Curl_removeHandleFromPipeline(data, &data->easy_conn->recv_pipe);

        /* expire the new receiving pipeline head */
        if(data->easy_conn->recv_pipe.head)
          Curl_expire(data->easy_conn->recv_pipe.head->ptr, 0, EXPIRE_RUN_NOW);

        /* Check if we can move pending requests to send pipe */
        Curl_multi_process_pending_handles(multi);

        /* When we follow redirects or is set to retry the connection, we must
           to go back to the CONNECT state */
        if(data->req.newurl || retry) {
          if(!retry) {
            /* if the URL is a follow-location and not just a retried request
               then figure out the URL here */
            free(newurl);
            newurl = data->req.newurl;
            data->req.newurl = NULL;
            follow = FOLLOW_REDIR;
          }
          else
            follow = FOLLOW_RETRY;
          result = multi_done(&data->easy_conn, CURLE_OK, FALSE);
          if(!result) {
            result = Curl_follow(data, newurl, follow);
            if(!result) {
              multistate(data, CURLM_STATE_CONNECT);
              rc = CURLM_CALL_MULTI_PERFORM;
            }
          }
        }
        else {
          /* after the transfer is done, go DONE */

          /* but first check to see if we got a location info even though we're
             not following redirects */
          if(data->req.location) {
            free(newurl);
            newurl = data->req.location;
            data->req.location = NULL;
            result = Curl_follow(data, newurl, FOLLOW_FAKE);
            if(result)
              stream_error = TRUE;
          }

          multistate(data, CURLM_STATE_DONE);
          rc = CURLM_CALL_MULTI_PERFORM;
        }
      }
      else if(comeback)
        rc = CURLM_CALL_MULTI_PERFORM;

      free(newurl);
      break;
    }

    case CURLM_STATE_DONE:
      /* this state is highly transient, so run another loop after this */
      rc = CURLM_CALL_MULTI_PERFORM;

      if(data->easy_conn) {
        CURLcode res;

        /* Remove ourselves from the receive pipeline, if we are there. */
        Curl_removeHandleFromPipeline(data, &data->easy_conn->recv_pipe);
        /* Check if we can move pending requests to send pipe */
        Curl_multi_process_pending_handles(multi);

        /* post-transfer command */
        res = multi_done(&data->easy_conn, result, FALSE);

        /* allow a previously set error code take precedence */
        if(!result)
          result = res;

        /*
         * If there are other handles on the pipeline, multi_done won't set
         * easy_conn to NULL.  In such a case, curl_multi_remove_handle() can
         * access free'd data, if the connection is free'd and the handle
         * removed before we perform the processing in CURLM_STATE_COMPLETED
         */
        if(data->easy_conn)
          data->easy_conn = NULL;
      }

      if(data->set.wildcardmatch) {
        if(data->wildcard.state != CURLWC_DONE) {
          /* if a wildcard is set and we are not ending -> lets start again
             with CURLM_STATE_INIT */
          multistate(data, CURLM_STATE_INIT);
          break;
        }
      }

      /* after we have DONE what we're supposed to do, go COMPLETED, and
         it doesn't matter what the multi_done() returned! */
      multistate(data, CURLM_STATE_COMPLETED);
      break;

    case CURLM_STATE_COMPLETED:
      /* this is a completed transfer, it is likely to still be connected */

      /* This node should be delinked from the list now and we should post
         an information message that we are complete. */

      /* Important: reset the conn pointer so that we don't point to memory
         that could be freed anytime */
      data->easy_conn = NULL;

      Curl_expire_clear(data); /* stop all timers */
      break;

    case CURLM_STATE_MSGSENT:
      data->result = result;
      return CURLM_OK; /* do nothing */

    default:
      return CURLM_INTERNAL_ERROR;
    }
    statemachine_end:

    if(data->mstate < CURLM_STATE_COMPLETED) {
      if(result) {
        /*
         * If an error was returned, and we aren't in completed state now,
         * then we go to completed and consider this transfer aborted.
         */

        /* NOTE: no attempt to disconnect connections must be made
           in the case blocks above - cleanup happens only here */

        data->state.pipe_broke = FALSE;

        /* Check if we can move pending requests to send pipe */
        Curl_multi_process_pending_handles(multi);

        if(data->easy_conn) {
          /* if this has a connection, unsubscribe from the pipelines */
          Curl_pipeline_leave_write(data->easy_conn);
          Curl_pipeline_leave_read(data->easy_conn);
          Curl_removeHandleFromPipeline(data, &data->easy_conn->send_pipe);
          Curl_removeHandleFromPipeline(data, &data->easy_conn->recv_pipe);

          if(stream_error) {
            /* Don't attempt to send data over a connection that timed out */
            bool dead_connection = result == CURLE_OPERATION_TIMEDOUT;
            /* disconnect properly */
            Curl_disconnect(data->easy_conn, dead_connection);

            /* This is where we make sure that the easy_conn pointer is reset.
               We don't have to do this in every case block above where a
               failure is detected */
            data->easy_conn = NULL;
          }
        }
        else if(data->mstate == CURLM_STATE_CONNECT) {
          /* Curl_connect() failed */
          (void)Curl_posttransfer(data);
        }

        multistate(data, CURLM_STATE_COMPLETED);
      }
      /* if there's still a connection to use, call the progress function */
      else if(data->easy_conn && Curl_pgrsUpdate(data->easy_conn)) {
        /* aborted due to progress callback return code must close the
           connection */
        result = CURLE_ABORTED_BY_CALLBACK;
        streamclose(data->easy_conn, "Aborted by callback");

        /* if not yet in DONE state, go there, otherwise COMPLETED */
        multistate(data, (data->mstate < CURLM_STATE_DONE)?
                   CURLM_STATE_DONE: CURLM_STATE_COMPLETED);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
    }

    if(CURLM_STATE_COMPLETED == data->mstate) {
      /* now fill in the Curl_message with this info */
      msg = &data->msg;

      msg->extmsg.msg = CURLMSG_DONE;
      msg->extmsg.easy_handle = data;
      msg->extmsg.data.result = result;

      rc = multi_addmsg(multi, msg);

      multistate(data, CURLM_STATE_MSGSENT);
    }
  } while((rc == CURLM_CALL_MULTI_PERFORM) || multi_ischanged(multi, FALSE));

  data->result = result;


  return rc;
}